

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusmenuregistrarproxy_p.cpp
# Opt level: O0

int __thiscall
QDBusMenuRegistrarInterface::qt_metacall
          (QDBusMenuRegistrarInterface *this,Call _c,int _id,void **_a)

{
  void **in_RCX;
  uint in_EDX;
  int in_ESI;
  QObject *in_RDI;
  undefined4 local_4;
  
  local_4 = QDBusAbstractInterface::qt_metacall((Call)in_RDI,in_ESI,(void **)(ulong)in_EDX);
  if (-1 < local_4) {
    if (in_ESI == 0) {
      if (local_4 < 4) {
        qt_static_metacall(in_RDI,InvokeMetaMethod,local_4,in_RCX);
      }
      local_4 = local_4 + -4;
    }
    if (in_ESI == 7) {
      if (local_4 < 4) {
        qt_static_metacall(in_RDI,RegisterMethodArgumentMetaType,local_4,in_RCX);
      }
      local_4 = local_4 + -4;
    }
  }
  return local_4;
}

Assistant:

int QDBusMenuRegistrarInterface::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QDBusAbstractInterface::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    return _id;
}